

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

IceTImage icetImageAssignBuffer(IceTVoid *buffer,IceTSizeType width,IceTSizeType height)

{
  undefined4 *puVar1;
  IceTSizeType IVar2;
  IceTInt *header;
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTImage image;
  IceTSizeType height_local;
  IceTSizeType width_local;
  IceTVoid *buffer_local;
  
  _depth_format = (undefined4 *)buffer;
  image.opaque_internals._0_4_ = height;
  image.opaque_internals._4_4_ = width;
  if (buffer == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Tried to create image with NULL buffer.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x144);
    buffer_local = (IceTVoid *)icetImageNull();
  }
  else {
    icetGetEnumv(9,(IceTEnum *)((long)&header + 4));
    icetGetEnumv(10,(IceTEnum *)&header);
    puVar1 = _depth_format;
    if (((header._4_4_ != 0xc001) && (header._4_4_ != 0xc002)) && (header._4_4_ != 0xc000)) {
      icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x150);
      header._4_4_ = 0xc000;
    }
    if (((IceTEnum)header != 0xd001) && ((IceTEnum)header != 0xd000)) {
      icetRaiseDiagnostic("Invalid depth format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x155);
      header._0_4_ = 0xd000;
    }
    *puVar1 = 0x4d5000;
    puVar1[1] = header._4_4_;
    puVar1[2] = (IceTEnum)header;
    puVar1[3] = image.opaque_internals._4_4_;
    puVar1[4] = (IceTSizeType)image.opaque_internals;
    puVar1[5] = image.opaque_internals._4_4_ * (IceTSizeType)image.opaque_internals;
    IVar2 = icetImageBufferSizeType
                      (header._4_4_,(IceTEnum)header,image.opaque_internals._4_4_,
                       (IceTSizeType)image.opaque_internals);
    puVar1[6] = IVar2;
    buffer_local = _depth_format;
  }
  return (IceTImage)buffer_local;
}

Assistant:

IceTImage icetImageAssignBuffer(IceTVoid *buffer,
                                IceTSizeType width,
                                IceTSizeType height)
{
    IceTImage image;
    IceTEnum color_format, depth_format;
    IceTInt *header;

    image.opaque_internals = buffer;

    if (buffer == NULL) {
        icetRaiseError("Tried to create image with NULL buffer.",
                       ICET_INVALID_VALUE);
        return icetImageNull();
    }

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

    header = ICET_IMAGE_HEADER(image);

    if (   (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
        && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
        && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
        color_format = ICET_IMAGE_COLOR_NONE;
    }
    if (   (depth_format != ICET_IMAGE_DEPTH_FLOAT)
        && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid depth format.", ICET_INVALID_ENUM);
        depth_format = ICET_IMAGE_DEPTH_NONE;
    }

    header[ICET_IMAGE_MAGIC_NUM_INDEX]          = ICET_IMAGE_MAGIC_NUM;
    header[ICET_IMAGE_COLOR_FORMAT_INDEX]       = color_format;
    header[ICET_IMAGE_DEPTH_FORMAT_INDEX]       = depth_format;
    header[ICET_IMAGE_WIDTH_INDEX]              = (IceTInt)width;
    header[ICET_IMAGE_HEIGHT_INDEX]             = (IceTInt)height;
    header[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]     = (IceTInt)(width*height);
    header[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX]
        = (IceTInt)icetImageBufferSizeType(color_format,
                                           depth_format,
                                           width,
                                           height);

    return image;
}